

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle.cpp
# Opt level: O3

void __thiscall OpenMD::GofRAngle::preProcess(GofRAngle *this)

{
  pointer pvVar1;
  pointer __s;
  long lVar2;
  ulong uVar3;
  pointer *ppdVar4;
  ulong uVar5;
  ulong uVar6;
  
  pvVar1 = (this->avgGofr_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->avgGofr_).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar2 != 0) {
    uVar5 = (lVar2 >> 3) * -0x5555555555555555;
    ppdVar4 = (pointer *)
              ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + 8);
    uVar6 = 1;
    do {
      __s = ((_Vector_impl_data *)(ppdVar4 + -1))->_M_start;
      if (__s != *ppdVar4) {
        memset(__s,0,((long)*ppdVar4 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
      }
      uVar3 = uVar6 & 0xffffffff;
      ppdVar4 = ppdVar4 + 3;
      uVar6 = uVar6 + 1;
    } while (uVar3 <= uVar5 && uVar5 - uVar3 != 0);
  }
  return;
}

Assistant:

void GofRAngle::preProcess() {
    for (unsigned int i = 0; i < avgGofr_.size(); ++i) {
      std::fill(avgGofr_[i].begin(), avgGofr_[i].end(), 0);
    }
  }